

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O2

int acmod_best_score(acmod_t *acmod,int *out_best_senid)

{
  byte bVar1;
  short sVar2;
  bin_mdef_t *pbVar3;
  int iVar4;
  int16 *piVar5;
  long lVar6;
  
  if (acmod->compallsen == '\0') {
    piVar5 = acmod->senone_scores;
    iVar4 = 0x7fff;
    for (lVar6 = 0; lVar6 < acmod->n_senone_active; lVar6 = lVar6 + 1) {
      bVar1 = acmod->senone_active[lVar6];
      sVar2 = piVar5[bVar1];
      if (sVar2 < iVar4) {
        *out_best_senid = (int)lVar6;
        iVar4 = (int)sVar2;
      }
      piVar5 = piVar5 + bVar1;
    }
  }
  else {
    pbVar3 = acmod->mdef;
    iVar4 = 0x7fff;
    for (lVar6 = 0; lVar6 < pbVar3->n_sen; lVar6 = lVar6 + 1) {
      sVar2 = acmod->senone_scores[lVar6];
      if (sVar2 < iVar4) {
        *out_best_senid = (int)lVar6;
        iVar4 = (int)sVar2;
      }
    }
  }
  return iVar4;
}

Assistant:

int
acmod_best_score(acmod_t *acmod, int *out_best_senid)
{
    int i, best;

    best = SENSCR_DUMMY;
    if (acmod->compallsen) {
        for (i = 0; i < bin_mdef_n_sen(acmod->mdef); ++i) {
            if (acmod->senone_scores[i] < best) {
                best = acmod->senone_scores[i];
                *out_best_senid = i;
            }
        }
    }
    else {
        int16 *senscr;
        senscr = acmod->senone_scores;
        for (i = 0; i < acmod->n_senone_active; ++i) {
            senscr += acmod->senone_active[i];
            if (*senscr < best) {
                best = *senscr;
                *out_best_senid = i;
            }
        }
    }
    return best;
}